

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::set_locale_ctype(char *str)

{
  Variable *pVVar1;
  
  pVVar1 = get_vars();
  std::__cxx11::string::assign((char *)&pVVar1->m_locale_ctype);
  return;
}

Assistant:

static bool IsEnableFlag(int flag) { return (GetInstance().m_test_flags & flag) ? true : false; }